

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

void __thiscall
ON_MeshCache::Internal_DeleteItem(ON_MeshCache *this,ON_MeshCacheItem *item,bool bDeleteMesh)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  if (item != (ON_MeshCacheItem *)0x0) {
    if ((bDeleteMesh) &&
       (this_00 = (item->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi, this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    onfree(item);
    return;
  }
  return;
}

Assistant:

void ON_MeshCache::Internal_DeleteItem(class ON_MeshCacheItem* item, bool bDeleteMesh)
{
  if (nullptr == item)
    return;
  void* p = (void*)item;

  // When bDeleteMesh is false, the memory used by item->m_mesh_sp and the ON_Mesh
  // it points to belongs to a memory pool that has been deleted because a worker
  // thread was canceled.  In this case, calling ~ON_MeshCacheItem() will crash the
  // application.
  if ( bDeleteMesh )
  {
    item->~ON_MeshCacheItem();
  }

  onfree(p);
}